

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O1

bool __thiscall gss::innards::SVOBitset::any(SVOBitset *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  uVar1 = this->n_words;
  if (uVar1 < 0x11) {
    bVar4 = uVar1 != 0;
    if ((bVar4) && ((this->_data).short_data[0] == 0)) {
      lVar2 = 1;
      do {
        lVar3 = lVar2;
        if (uVar1 == (uint)lVar3) break;
        lVar2 = lVar3 + 1;
      } while ((this->_data).short_data[lVar3] == 0);
      goto LAB_0011906e;
    }
  }
  else {
    bVar4 = true;
    if (*(this->_data).long_data == 0) {
      lVar2 = 1;
      do {
        lVar3 = lVar2;
        if (uVar1 == (uint)lVar3) break;
        lVar2 = lVar3 + 1;
      } while ((this->_data).long_data[lVar3] == 0);
LAB_0011906e:
      return (uint)lVar3 < uVar1;
    }
  }
  return bVar4;
}

Assistant:

constexpr auto _is_long() const -> bool
        {
            return n_words > svo_size;
        }